

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall
QTreeWidgetItem::QTreeWidgetItem(QTreeWidgetItem *this,QTreeWidgetItem *parent,int type)

{
  long lVar1;
  QFlagsStorageHelper<Qt::ItemFlag,_4> QVar2;
  QTreeWidgetItem *this_00;
  undefined4 in_EDX;
  long in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffb8;
  ItemFlag in_stack_ffffffffffffffbc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = &PTR__QTreeWidgetItem_00d31678;
  *(undefined4 *)(in_RDI + 1) = in_EDX;
  QList<QList<QWidgetItemData>_>::QList((QList<QList<QWidgetItemData>_> *)0x91369c);
  in_RDI[5] = 0;
  this_00 = (QTreeWidgetItem *)operator_new(0x30);
  QTreeWidgetItemPrivate::QTreeWidgetItemPrivate
            ((QTreeWidgetItemPrivate *)this_00,
             (QTreeWidgetItem *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  in_RDI[6] = this_00;
  in_RDI[7] = 0;
  QList<QTreeWidgetItem_*>::QList((QList<QTreeWidgetItem_*> *)0x9136e4);
  Qt::operator|((enum_type)((ulong)this_00 >> 0x20),(enum_type)this_00);
  QFlags<Qt::ItemFlag>::operator|((QFlags<Qt::ItemFlag> *)this_00,in_stack_ffffffffffffffbc);
  QFlags<Qt::ItemFlag>::operator|((QFlags<Qt::ItemFlag> *)this_00,in_stack_ffffffffffffffbc);
  QVar2.super_QFlagsStorage<Qt::ItemFlag>.i =
       (QFlagsStorage<Qt::ItemFlag>)
       QFlags<Qt::ItemFlag>::operator|((QFlags<Qt::ItemFlag> *)this_00,in_stack_ffffffffffffffbc);
  ((QFlagsStorageHelper<Qt::ItemFlag,_4> *)(in_RDI + 0xb))->super_QFlagsStorage<Qt::ItemFlag> =
       QVar2.super_QFlagsStorage<Qt::ItemFlag>.i;
  if (in_RSI != 0) {
    addChild(this_00,(QTreeWidgetItem *)
                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTreeWidgetItem::QTreeWidgetItem(QTreeWidgetItem *parent, int type)
    : rtti(type), d(new QTreeWidgetItemPrivate(this))
{
    if (parent)
        parent->addChild(this);
}